

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *p,int iMint)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int u;
  int t;
  int s;
  int j;
  int n;
  int k;
  int i;
  int iMint_local;
  Zyx_Man_t *p_local;
  
  if ((p->pPars->fMajority != 0) || (3 < p->pPars->nLutSize)) {
    __assert_fail("!p->pPars->fMajority && p->pPars->nLutSize < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x427,"int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *, int)");
  }
  p->Counts[iMint] = p->Counts[iMint] + 1;
  if (p->pPars->nLutSize == 2) {
    for (n = p->pPars->nVars; n < p->nObjs; n = n + 1) {
      for (u = 0; local_34 = u, u < n; u = u + 1) {
        while (local_34 = local_34 + 1, local_34 < n) {
          p->pFanins[n][0] = u;
          p->pFanins[n][1] = local_34;
          for (j = 0; j <= p->LutMask; j = j + 1) {
            for (s = 0; s < 2; s = s + 1) {
              p->nLits[0] = 0;
              iVar1 = Zyx_FuncVar(p,n,j);
              iVar2 = Abc_Var2Lit(iVar1,s);
              iVar1 = p->nLits[0];
              p->nLits[0] = iVar1 + 1;
              p->pLits[0][iVar1] = iVar2;
              for (t = 0; t < p->pPars->nLutSize; t = t + 1) {
                iVar1 = Zyx_TopoVar(p,n,p->pFanins[n][t]);
                iVar2 = Abc_Var2Lit(iVar1,1);
                iVar1 = p->nLits[0];
                p->nLits[0] = iVar1 + 1;
                p->pLits[0][iVar1] = iVar2;
                iVar1 = Zyx_MintVar(p,iMint,p->pFanins[n][t]);
                iVar2 = Abc_Var2Lit(iVar1,j >> ((byte)t & 0x1f) & 1);
                iVar1 = p->nLits[0];
                p->nLits[0] = iVar1 + 1;
                p->pLits[0][iVar1] = iVar2;
              }
              iVar1 = Zyx_MintVar(p,iMint,n);
              iVar2 = Abc_Var2Lit(iVar1,(uint)((s != 0 ^ 0xffU) & 1));
              iVar1 = p->nLits[0];
              p->nLits[0] = iVar1 + 1;
              p->pLits[0][iVar1] = iVar2;
              iVar1 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
              if (iVar1 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
  }
  else if (p->pPars->nLutSize == 3) {
    for (n = p->pPars->nVars; n < p->nObjs; n = n + 1) {
      for (u = 0; iVar1 = u, u < n; u = u + 1) {
        while (local_34 = iVar1 + 1, local_34 < n) {
          for (local_38 = iVar1 + 2; iVar1 = local_34, local_38 < n; local_38 = local_38 + 1) {
            p->pFanins[n][0] = u;
            p->pFanins[n][1] = local_34;
            p->pFanins[n][2] = local_38;
            for (j = 0; j <= p->LutMask; j = j + 1) {
              for (s = 0; s < 2; s = s + 1) {
                p->nLits[0] = 0;
                iVar1 = Zyx_FuncVar(p,n,j);
                iVar2 = Abc_Var2Lit(iVar1,s);
                iVar1 = p->nLits[0];
                p->nLits[0] = iVar1 + 1;
                p->pLits[0][iVar1] = iVar2;
                for (t = 0; t < p->pPars->nLutSize; t = t + 1) {
                  iVar1 = Zyx_TopoVar(p,n,p->pFanins[n][t]);
                  iVar2 = Abc_Var2Lit(iVar1,1);
                  iVar1 = p->nLits[0];
                  p->nLits[0] = iVar1 + 1;
                  p->pLits[0][iVar1] = iVar2;
                  iVar1 = Zyx_MintVar(p,iMint,p->pFanins[n][t]);
                  iVar2 = Abc_Var2Lit(iVar1,j >> ((byte)t & 0x1f) & 1);
                  iVar1 = p->nLits[0];
                  p->nLits[0] = iVar1 + 1;
                  p->pLits[0][iVar1] = iVar2;
                }
                iVar1 = Zyx_MintVar(p,iMint,n);
                iVar2 = Abc_Var2Lit(iVar1,(uint)((s != 0 ^ 0xffU) & 1));
                iVar1 = p->nLits[0];
                p->nLits[0] = iVar1 + 1;
                p->pLits[0][iVar1] = iVar2;
                iVar1 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfLazyFunc( Zyx_Man_t * p, int iMint )
{
    int i, k, n, j, s, t, u;
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    assert( !p->pPars->fMajority && p->pPars->nLutSize < 4 );
    p->Counts[iMint]++;
    if ( p->pPars->nLutSize == 2 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    else if ( p->pPars->nLutSize == 3 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        for ( u = t+1;             u < i;        u++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            p->pFanins[i][2] = u;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    return 1;
}